

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O2

_Bool Curl_uint_spbset_first(uint_spbset *bset,uint *pfirst)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  curl_uint64_t *pcVar5;
  
  uVar4 = 0;
  do {
    if (bset == (uint_spbset *)0x0) {
LAB_0015b428:
      *pfirst = uVar4;
      return bset != (uint_spbset *)0x0;
    }
    pcVar5 = (curl_uint64_t *)bset;
    for (lVar3 = 0; pcVar5 = pcVar5 + 1, lVar3 != -0x100; lVar3 = lVar3 + -0x40) {
      uVar1 = *pcVar5;
      if (uVar1 != 0) {
        lVar2 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar4 = ((int)lVar2 + (int)*(ulong *)((long)bset + 0x28)) - (int)lVar3;
        goto LAB_0015b428;
      }
    }
    bset = *(uint_spbset **)bset;
  } while( true );
}

Assistant:

bool Curl_uint_spbset_first(struct uint_spbset *bset, unsigned int *pfirst)
{
  struct uint_spbset_chunk *chunk;
  unsigned int i;

  for(chunk = &bset->head; chunk; chunk = chunk->next) {
    for(i = 0; i < CURL_UINT_SPBSET_CH_SLOTS; ++i) {
      if(chunk->slots[i]) {
        *pfirst = chunk->offset + ((i * 64) + CURL_CTZ64(chunk->slots[i]));
        return TRUE;
      }
    }
  }
  *pfirst = 0; /* give it a defined value even if it should not be used */
  return FALSE;
}